

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageClipper.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined1 *puVar2;
  string *psVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  long lVar7;
  undefined8 uVar8;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  char *local_b8;
  char *local_b0 [2];
  char local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Starting Coverage Clipper",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  std::__cxx11::string::string((string *)local_b0,argv[1],(allocator *)&local_b8);
  iVar4 = std::__cxx11::string::compare((char *)local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (iVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Clipping coverage: ",0x13);
    pcVar1 = argv[2];
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107108);
    }
    else {
      sVar5 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__cxx11::string::string((string *)&local_50,argv[2],&local_b9);
    std::__cxx11::string::string((string *)&local_70,argv[3],&local_ba);
    std::__cxx11::string::string((string *)local_b0,argv[4],&local_bb);
    pcVar1 = local_b0[0];
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol(pcVar1,&local_b8,10);
    if (local_b8 == pcVar1) {
      std::__throw_invalid_argument("stoi");
LAB_00102e66:
      uVar8 = std::__throw_out_of_range("stoi");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      _Unwind_Resume(uVar8);
    }
    if (((int)lVar7 != lVar7) || (*piVar6 == 0x22)) goto LAB_00102e66;
    if (*piVar6 == 0) {
      *piVar6 = iVar4;
    }
    clipCoverage(&local_50,&local_70,(int)lVar7);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    psVar3 = &local_50;
  }
  else {
    std::__cxx11::string::string((string *)local_b0,argv[1],(allocator *)&local_b8);
    iVar4 = std::__cxx11::string::compare((char *)local_b0);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if (iVar4 != 0) goto LAB_00102e0b;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Counting max depth: ",0x14);
    pcVar1 = argv[2];
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107108);
    }
    else {
      sVar5 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__cxx11::string::string((string *)&local_90,argv[2],(allocator *)local_b0);
    countCoverage(&local_90);
    psVar3 = &local_90;
  }
  puVar2 = *(undefined1 **)((psVar3->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 != &psVar3->field_2) {
    operator_delete(puVar2);
  }
LAB_00102e0b:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Ended Coverage Clipper",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {


    cout << "Starting Coverage Clipper"<<endl;
    if(std::string(argv[1]) == "--c"){
        cout<<"Clipping coverage: "<<argv[2]<<endl;
        clipCoverage(argv[2],argv[3],stoi(argv[4]));
    }else if(std::string(argv[1]) == "--f"){
        cout<<"Counting max depth: "<<argv[2]<<endl;
        countCoverage(argv[2]);
    }

    cout << "Ended Coverage Clipper"<< endl;


}